

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O2

unique_ptr<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>_>
groundupdbext::EmbeddedDatabase::createEmpty
          (string *dbname,
          unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
          *kvStore,unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
                   *idxStore)

{
  string local_40 [32];
  
  std::__cxx11::string::string(local_40,(string *)kvStore);
  Impl::createEmpty(dbname,(unique_ptr<groundupdb::KeyValueStore,_std::default_delete<groundupdb::KeyValueStore>_>
                            *)local_40,idxStore);
  std::__cxx11::string::~string(local_40);
  return (__uniq_ptr_data<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>,_true,_true>
          )(__uniq_ptr_data<groundupdb::IDatabase,_std::default_delete<groundupdb::IDatabase>,_true,_true>
            )dbname;
}

Assistant:

const std::unique_ptr<IDatabase> EmbeddedDatabase::createEmpty(std::string dbname,std::unique_ptr<KeyValueStore>& kvStore,std::unique_ptr<KeyValueStore>& idxStore) {
  return EmbeddedDatabase::Impl::createEmpty(dbname, kvStore, idxStore);
}